

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_str_free(nk_str *str)

{
  void *pvVar1;
  nk_plugin_free p_Var2;
  
  if (str != (nk_str *)0x0) {
    pvVar1 = (str->buffer).memory.ptr;
    if (((pvVar1 != (void *)0x0) && ((str->buffer).type != NK_BUFFER_FIXED)) &&
       (p_Var2 = (str->buffer).pool.free, p_Var2 != (nk_plugin_free)0x0)) {
      (*p_Var2)((str->buffer).pool.userdata,pvVar1);
    }
    str->len = 0;
    return;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x1c53,"void nk_str_free(struct nk_str *)");
}

Assistant:

NK_API void
nk_str_free(struct nk_str *str)
{
    NK_ASSERT(str);
    nk_buffer_free(&str->buffer);
    str->len = 0;
}